

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::
HeapDisposer<kj::_::AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_>_>
::disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_>_>
              *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_>::
    ~AdapterPromiseNode((AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_>
                         *)pointer);
  }
  operator_delete(pointer,0x198);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }